

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynModule * ParseModule(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynBase> expressions_00;
  IntrusiveList<SynBase> expressions_01;
  IntrusiveList<SynModuleImport> imports_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  SynBase *node;
  Lexeme *pLVar4;
  IntrusiveList<SynModuleImport> IVar5;
  IntrusiveList<SynBase> IVar6;
  SynBase *expression;
  IntrusiveList<SynBase> expressions;
  IntrusiveList<SynModuleImport> imports;
  Lexeme *start;
  TraceScope traceScope;
  ParseContext *ctx_local;
  
  if ((ParseModule(ParseContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ParseModule(ParseContext&)::token), iVar2 != 0)) {
    ParseModule::token = NULLC::TraceGetToken("parser","ParseModule");
    __cxa_guard_release(&ParseModule(ParseContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&start,ParseModule::token);
  begin = ctx->currentLexeme;
  (ctx->statistics).finishTime = 0;
  IVar5 = ParseImports(ctx);
  expressions.tail = &(IVar5.head)->super_SynBase;
  uVar3 = NULLCTime::clockMicro();
  CompilerStatistics::Start(&ctx->statistics,uVar3);
  IVar6 = ParseExpressions(ctx);
  while( true ) {
    expressions.head = IVar6.tail;
    expression = IVar6.head;
    bVar1 = ParseContext::Consume(ctx,lex_none);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pLVar4 = ParseContext::Current(ctx);
    anon_unknown.dwarf_fc7e::Report(ctx,pLVar4,"ERROR: unexpected symbol");
    ParseContext::Skip(ctx);
    while( true ) {
      node = ParseExpression(ctx);
      IVar6.tail = expressions.head;
      IVar6.head = expression;
      if (node == (SynBase *)0x0) break;
      IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&expression,node);
    }
  }
  uVar3 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Parse",uVar3);
  bVar1 = IntrusiveList<SynBase>::empty((IntrusiveList<SynBase> *)&expression);
  if (bVar1) {
    pLVar4 = ParseContext::Current(ctx);
    anon_unknown.dwarf_fc7e::Report(ctx,pLVar4,"ERROR: module contains no code");
    ctx_local = (ParseContext *)ParseContext::get<SynModule>(ctx);
    pLVar4 = ParseContext::Current(ctx);
    IVar5.tail = IVar5.tail;
    IVar5.head = (SynModuleImport *)expressions.tail;
    expressions_00.tail = expressions.head;
    expressions_00.head = expression;
    SynModule::SynModule((SynModule *)ctx_local,begin,pLVar4,IVar5,expressions_00);
  }
  else {
    ctx_local = (ParseContext *)ParseContext::get<SynModule>(ctx);
    pLVar4 = ParseContext::Previous(ctx);
    imports_00.tail = IVar5.tail;
    imports_00.head = (SynModuleImport *)expressions.tail;
    expressions_01.tail = expressions.head;
    expressions_01.head = expression;
    SynModule::SynModule((SynModule *)ctx_local,begin,pLVar4,imports_00,expressions_01);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&start);
  return (SynModule *)ctx_local;
}

Assistant:

SynModule* ParseModule(ParseContext &ctx)
{
	TRACE_SCOPE("parser", "ParseModule");

	Lexeme *start = ctx.currentLexeme;

	// Ignore nested import timing
	ctx.statistics.finishTime = 0;

	IntrusiveList<SynModuleImport> imports = ParseImports(ctx);

	ctx.statistics.Start(NULLCTime::clockMicro());

	IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

	while(!ctx.Consume(lex_none))
	{
		Report(ctx, ctx.Current(), "ERROR: unexpected symbol");

		ctx.Skip();

		while(SynBase* expression = ParseExpression(ctx))
			expressions.push_back(expression);
	}

	ctx.statistics.Finish("Parse", NULLCTime::clockMicro());

	if(expressions.empty())
	{
		Report(ctx, ctx.Current(), "ERROR: module contains no code");

		return new (ctx.get<SynModule>()) SynModule(start, ctx.Current(), imports, expressions);
	}

	return new (ctx.get<SynModule>()) SynModule(start, ctx.Previous(), imports, expressions);
}